

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateGetEnumDescriptorSpecializations
          (MessageGenerator *this,Printer *printer)

{
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *psVar1;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *psVar2;
  char *__function;
  long lVar3;
  
  if (0 < *(int *)(this->descriptor_ + 0x38)) {
    lVar3 = 0;
    do {
      psVar1 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator[](&this->nested_generators_,lVar3);
      if (psVar1->ptr_ == (MessageGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->() const [C = google::protobuf::compiler::cpp::MessageGenerator]"
        ;
        goto LAB_00193d5a;
      }
      GenerateGetEnumDescriptorSpecializations(psVar1->ptr_,printer);
      lVar3 = lVar3 + 1;
    } while (lVar3 < *(int *)(this->descriptor_ + 0x38));
  }
  if (0 < *(int *)(this->descriptor_ + 0x48)) {
    lVar3 = 0;
    do {
      psVar2 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
               ::operator[](&this->enum_generators_,lVar3);
      if (psVar2->ptr_ == (EnumGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::operator->() const [C = google::protobuf::compiler::cpp::EnumGenerator]"
        ;
LAB_00193d5a:
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                      ,0x1e2,__function);
      }
      EnumGenerator::GenerateGetEnumDescriptorSpecializations(psVar2->ptr_,printer);
      lVar3 = lVar3 + 1;
    } while (lVar3 < *(int *)(this->descriptor_ + 0x48));
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateGetEnumDescriptorSpecializations(io::Printer* printer) {
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
  }
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
  }
}